

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

optional<pbrt::SpectrumHandle> __thiscall
pbrt::PiecewiseLinearSpectrum::Read(PiecewiseLinearSpectrum *this,string *fn,Allocator alloc)

{
  uintptr_t iptr;
  PiecewiseLinearSpectrum *pPVar1;
  undefined8 extraout_RDX;
  ulong uVar2;
  long lVar3;
  optional<pbrt::SpectrumHandle> oVar4;
  vector<float,_std::allocator<float>_> vals;
  vector<float,_std::allocator<float>_> lambda;
  vector<float,_std::allocator<float>_> v;
  _Vector_base<float,_std::allocator<float>_> local_90;
  polymorphic_allocator<std::byte> local_78;
  int local_6c;
  _Vector_base<float,_std::allocator<float>_> local_68;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  local_78.memoryResource = alloc.memoryResource;
  ReadFloatFile((vector<float,_std::allocator<float>_> *)&local_90,fn);
  if (local_90._M_impl.super__Vector_impl_data._M_start ==
      local_90._M_impl.super__Vector_impl_data._M_finish) {
    Warning<std::__cxx11::string_const&>("%s: unable to read spectrum file.",fn);
  }
  else {
    if (((int)local_90._M_impl.super__Vector_impl_data._M_finish -
         (int)local_90._M_impl.super__Vector_impl_data._M_start & 4U) == 0) {
      lVar3 = 0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (uVar2 = 0;
          uVar2 < (ulong)((long)local_90._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_90._M_impl.super__Vector_impl_data._M_start >> 2) >> 1;
          uVar2 = uVar2 + 1) {
        if ((uVar2 != 0) &&
           (*(float *)((long)local_90._M_impl.super__Vector_impl_data._M_start + lVar3) <=
            local_68._M_impl.super__Vector_impl_data._M_finish[-1])) {
          local_6c = (int)uVar2;
          Warning<std::__cxx11::string_const&,int,float&,float&>
                    ("%s: spectrum file invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                     ,fn,&local_6c,local_68._M_impl.super__Vector_impl_data._M_finish + -1,
                     (float *)((long)local_90._M_impl.super__Vector_impl_data._M_start + lVar3));
          (this->lambdas).alloc.memoryResource = (memory_resource *)0x0;
          (this->lambdas).ptr = (float *)0x0;
          goto LAB_00301870;
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_68,
                   (value_type_conflict1 *)
                   ((long)local_90._M_impl.super__Vector_impl_data._M_start + lVar3));
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_48,
                   (value_type_conflict1 *)
                   ((long)local_90._M_impl.super__Vector_impl_data._M_start + lVar3 + 4));
        lVar3 = lVar3 + 8;
      }
      pPVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::PiecewiseLinearSpectrum,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         (&local_78,(vector<float,_std::allocator<float>_> *)&local_68,
                          (vector<float,_std::allocator<float>_> *)&local_48,&local_78);
      *(undefined1 *)&(this->lambdas).ptr = 1;
      (this->lambdas).alloc.memoryResource = (memory_resource *)((ulong)pPVar1 | 0x3000000000000);
LAB_00301870:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
      goto LAB_00301884;
    }
    Warning<std::__cxx11::string_const&>("%s: extra value found in spectrum file.",fn);
  }
  (this->lambdas).alloc.memoryResource = (memory_resource *)0x0;
  (this->lambdas).ptr = (float *)0x0;
LAB_00301884:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_90);
  oVar4._8_8_ = extraout_RDX;
  oVar4.optionalValue =
       (aligned_storage_t<sizeof(pbrt::SpectrumHandle),_alignof(pbrt::SpectrumHandle)>)this;
  return oVar4;
}

Assistant:

pstd::optional<SpectrumHandle> PiecewiseLinearSpectrum::Read(const std::string &fn,
                                                             Allocator alloc) {
    std::vector<Float> vals = ReadFloatFile(fn);
    if (vals.empty()) {
        Warning("%s: unable to read spectrum file.", fn);
        return {};
    } else {
        if (vals.size() % 2 != 0) {
            Warning("%s: extra value found in spectrum file.", fn);
            return {};
        }
        std::vector<Float> lambda, v;
        for (size_t i = 0; i < vals.size() / 2; ++i) {
            if (i > 0 && vals[2 * i] <= lambda.back()) {
                Warning("%s: spectrum file invalid: at %d'th entry, "
                        "wavelengths aren't "
                        "increasing: %f >= %f.",
                        fn, int(i), lambda.back(), vals[2 * i]);
                return {};
            }
            lambda.push_back(vals[2 * i]);
            v.push_back(vals[2 * i + 1]);
        }
        SpectrumHandle handle =
            alloc.new_object<PiecewiseLinearSpectrum>(lambda, v, alloc);
        return handle;
    }
}